

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

uint * fetchTransformedBilinear<(TextureBlendType)5,(QPixelLayout::BPP)4>
                 (uint *buffer,Operator *param_2,QSpanData *data,int y,int x,int length)

{
  ulong uVar1;
  Format FVar2;
  long lVar3;
  QList<unsigned_int> *pQVar4;
  uchar *puVar5;
  long lVar6;
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  unkuint9 Var20;
  undefined1 auVar21 [11];
  undefined1 auVar22 [13];
  undefined1 auVar23 [15];
  unkuint9 Var24;
  undefined1 auVar25 [11];
  undefined1 auVar26 [13];
  undefined1 auVar27 [14];
  undefined1 auVar28 [12];
  unkbyte10 Var29;
  undefined1 auVar30 [14];
  undefined1 auVar31 [12];
  unkbyte10 Var32;
  undefined1 auVar33 [14];
  undefined1 auVar34 [12];
  undefined1 auVar35 [14];
  undefined1 auVar36 [12];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  int iVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  ulong uVar45;
  long lVar46;
  long lVar47;
  ulong uVar48;
  int iVar49;
  long lVar50;
  uint uVar51;
  uint *puVar52;
  anon_union_80_2_ea1780ee_for_QSpanData_24 *image;
  ulong uVar53;
  long in_FS_OFFSET;
  short sVar54;
  short sVar81;
  double dVar55;
  double dVar56;
  byte bVar82;
  undefined1 auVar57 [12];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar58 [12];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar80 [16];
  double dVar83;
  double dVar84;
  undefined1 auVar85 [12];
  byte bVar107;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  short sVar108;
  short sVar111;
  double dVar109;
  double dVar112;
  undefined1 auVar110 [16];
  double dVar113;
  double dVar114;
  uint uVar115;
  ushort uVar116;
  uint uVar117;
  ushort uVar119;
  double dVar118;
  int iVar120;
  undefined1 uVar121;
  undefined1 uVar122;
  undefined1 uVar123;
  undefined1 uVar124;
  undefined1 uVar125;
  undefined1 uVar126;
  undefined1 uVar127;
  undefined1 uVar128;
  int in_stack_ffffffffffffaed8;
  short local_5108;
  short sStack_5106;
  double local_50d8;
  undefined1 local_50a8 [16];
  double local_5098;
  double dStack_5090;
  ushort distys [1024];
  ushort distxs [1024];
  uint buf2 [2048];
  uint buf1 [2048];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar59 [16];
  undefined1 auVar68 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  
  uVar53 = (ulong)(uint)length;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  FVar2 = (data->field_23).texture.format;
  pQVar4 = (data->field_23).texture.colorTable;
  dVar83 = (double)x + 0.5;
  dVar118 = (double)y + 0.5;
  dVar114 = data->dx;
  if ((data->field_0x8a & 1) == 0) {
    local_5098 = data->m11;
    dStack_5090 = data->m12;
    local_50a8._0_8_ = data->m21;
    local_50a8._8_8_ = data->m22;
    local_50d8 = data->dy;
  }
  else {
    local_5098 = data->m11;
    dStack_5090 = data->m12;
    local_50a8._0_8_ = data->m21;
    local_50a8._8_8_ = data->m22;
    uVar121 = (undefined1)local_50a8._0_8_;
    uVar122 = (undefined1)((ulong)local_50a8._0_8_ >> 8);
    uVar123 = (undefined1)((ulong)local_50a8._0_8_ >> 0x10);
    uVar124 = (undefined1)((ulong)local_50a8._0_8_ >> 0x18);
    uVar125 = (undefined1)((ulong)local_50a8._0_8_ >> 0x20);
    uVar126 = (undefined1)((ulong)local_50a8._0_8_ >> 0x28);
    uVar127 = (undefined1)((ulong)local_50a8._0_8_ >> 0x30);
    uVar128 = (undefined1)((ulong)local_50a8._0_8_ >> 0x38);
    local_50d8 = data->dy;
    dVar109 = (dVar114 + dVar118 * (double)local_50a8._0_8_ + dVar83 * local_5098) * 65536.0;
    dVar112 = (local_50d8 + dVar118 * (double)local_50a8._8_8_ + dVar83 * dStack_5090) * 65536.0;
    dVar84 = dVar112;
    if (dVar109 <= dVar112) {
      dVar84 = dVar109;
    }
    dVar55 = trunc(local_5098 * 65536.0);
    dVar56 = trunc(dStack_5090 * 65536.0);
    dVar113 = (double)length * dVar55 + dVar109;
    dVar56 = (double)length * dVar56 + dVar112;
    dVar55 = dVar56;
    if (dVar113 <= dVar56) {
      dVar55 = dVar113;
    }
    if (dVar84 <= dVar55) {
      dVar55 = dVar84;
    }
    if (-2147483648.0 <= dVar55) {
      dVar84 = dVar112;
      if (dVar112 <= dVar109) {
        dVar84 = dVar109;
      }
      if (dVar56 <= dVar84) {
        dVar56 = dVar84;
      }
      if (dVar56 <= 2147483647.0) {
        image = &data->field_23;
        uVar117 = (uint)(local_5098 * 65536.0);
        iVar120 = (int)(dStack_5090 * 65536.0);
        distxs._0_4_ = (int)dVar109 - 0x8000;
        uVar115 = (int)dVar112 - 0x8000;
        if (iVar120 != 0) {
          puVar52 = buffer;
          uVar42 = distxs._0_4_;
          if (length != 0) {
            do {
              iVar41 = (int)uVar53;
              uVar45 = 0x400;
              if (iVar41 < 0x400) {
                uVar45 = uVar53;
              }
              iVar49 = (int)uVar45;
              fetchTransformedBilinear_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)4,unsigned_int>
                        (buf1,buf2,iVar49,&image->texture,uVar42,uVar115,uVar117,iVar120);
              (*qPixelLayouts[FVar2].convertToARGB32PM)(buf1,iVar49 * 2,pQVar4);
              (*qPixelLayouts[FVar2].convertToARGB32PM)(buf2,iVar49 * 2,pQVar4);
              if (0 < iVar41) {
                uVar48 = 0;
                uVar53 = CONCAT17(uVar128,CONCAT16(uVar127,CONCAT15(uVar126,CONCAT14(uVar125,
                                                  CONCAT13(uVar124,CONCAT12(uVar123,CONCAT11(uVar122
                                                  ,uVar121))))))) ^
                         CONCAT17(uVar128,CONCAT16(uVar127,CONCAT15(uVar126,CONCAT14(uVar125,
                                                  CONCAT13(uVar124,CONCAT12(uVar123,CONCAT11(uVar122
                                                  ,uVar121)))))));
                uVar121 = (undefined1)uVar53;
                uVar122 = (undefined1)(uVar53 >> 8);
                uVar123 = (undefined1)(uVar53 >> 0x10);
                uVar124 = (undefined1)(uVar53 >> 0x18);
                uVar125 = (undefined1)(uVar53 >> 0x20);
                uVar126 = (undefined1)(uVar53 >> 0x28);
                uVar127 = (undefined1)(uVar53 >> 0x30);
                uVar128 = (undefined1)(uVar53 >> 0x38);
                do {
                  uVar51 = uVar42 >> 8 & 0xff;
                  uVar53 = *(ulong *)(buf1 + uVar48 * 2);
                  uVar1 = *(ulong *)(buf2 + uVar48 * 2);
                  auVar110._8_6_ = 0;
                  auVar110._0_8_ = uVar53;
                  auVar110[0xe] = (char)(uVar53 >> 0x38);
                  auVar110[0xf] = uVar128;
                  auVar95._14_2_ = auVar110._14_2_;
                  auVar95._8_5_ = 0;
                  auVar95._0_8_ = uVar53;
                  auVar95[0xd] = uVar127;
                  auVar67._13_3_ = auVar95._13_3_;
                  auVar67._8_4_ = 0;
                  auVar67._0_8_ = uVar53;
                  auVar67[0xc] = (char)(uVar53 >> 0x30);
                  auVar66._12_4_ = auVar67._12_4_;
                  auVar66._8_3_ = 0;
                  auVar66._0_8_ = uVar53;
                  auVar66[0xb] = uVar126;
                  auVar65._11_5_ = auVar66._11_5_;
                  auVar65._8_2_ = 0;
                  auVar65._0_8_ = uVar53;
                  auVar65[10] = (char)(uVar53 >> 0x28);
                  auVar64._10_6_ = auVar65._10_6_;
                  auVar64[8] = 0;
                  auVar64._0_8_ = uVar53;
                  auVar64[9] = uVar125;
                  auVar63._9_7_ = auVar64._9_7_;
                  auVar63[8] = (char)(uVar53 >> 0x20);
                  auVar63._0_8_ = uVar53;
                  Var29 = CONCAT91(CONCAT81(auVar63._8_8_,uVar124),(char)(uVar53 >> 0x18));
                  auVar28._2_10_ = Var29;
                  auVar28[1] = uVar123;
                  auVar28[0] = (char)(uVar53 >> 0x10);
                  auVar27._2_12_ = auVar28;
                  auVar27[1] = uVar122;
                  auVar27[0] = (char)(uVar53 >> 8);
                  auVar93._8_6_ = 0;
                  auVar93._0_8_ = uVar1;
                  auVar93[0xe] = (char)(uVar1 >> 0x38);
                  auVar93[0xf] = uVar128;
                  auVar92._14_2_ = auVar93._14_2_;
                  auVar92._8_5_ = 0;
                  auVar92._0_8_ = uVar1;
                  auVar92[0xd] = uVar127;
                  auVar91._13_3_ = auVar92._13_3_;
                  auVar91._8_4_ = 0;
                  auVar91._0_8_ = uVar1;
                  auVar91[0xc] = (char)(uVar1 >> 0x30);
                  auVar90._12_4_ = auVar91._12_4_;
                  auVar90._8_3_ = 0;
                  auVar90._0_8_ = uVar1;
                  auVar90[0xb] = uVar126;
                  auVar89._11_5_ = auVar90._11_5_;
                  auVar89._8_2_ = 0;
                  auVar89._0_8_ = uVar1;
                  auVar89[10] = (char)(uVar1 >> 0x28);
                  auVar88._10_6_ = auVar89._10_6_;
                  auVar88[8] = 0;
                  auVar88._0_8_ = uVar1;
                  auVar88[9] = uVar125;
                  auVar87._9_7_ = auVar88._9_7_;
                  auVar87[8] = (char)(uVar1 >> 0x20);
                  auVar87._0_8_ = uVar1;
                  Var32 = CONCAT91(CONCAT81(auVar87._8_8_,uVar124),(char)(uVar1 >> 0x18));
                  auVar31._2_10_ = Var32;
                  auVar31[1] = uVar123;
                  auVar31[0] = (char)(uVar1 >> 0x10);
                  auVar30._2_12_ = auVar31;
                  auVar30[1] = uVar122;
                  auVar30[0] = (char)(uVar1 >> 8);
                  uVar44 = uVar115 >> 8 & 0xff;
                  auVar110 = pshuflw(ZEXT416(0x100 - uVar44),ZEXT416(0x100 - uVar44),0);
                  sVar108 = auVar110._0_2_;
                  sVar111 = auVar110._2_2_;
                  auVar110 = pshuflw(ZEXT416(uVar44),ZEXT416(uVar44),0);
                  sVar54 = auVar110._0_2_;
                  sVar81 = auVar110._2_2_;
                  auVar69._0_4_ =
                       CONCAT22(sVar81 * auVar30._0_2_ + sVar111 * auVar27._0_2_,
                                sVar54 * CONCAT11(uVar121,(char)uVar1) +
                                sVar108 * CONCAT11(uVar121,(char)uVar53));
                  auVar58._0_8_ =
                       CONCAT26(sVar81 * (short)Var32 + sVar111 * (short)Var29,
                                CONCAT24(sVar54 * auVar31._0_2_ + sVar108 * auVar28._0_2_,
                                         auVar69._0_4_));
                  auVar58._8_2_ = sVar54 * auVar87._8_2_ + sVar108 * auVar63._8_2_;
                  auVar58._10_2_ = sVar81 * auVar89._10_2_ + sVar111 * auVar65._10_2_;
                  auVar68._12_2_ = sVar54 * auVar91._12_2_ + sVar108 * auVar67._12_2_;
                  auVar68._0_12_ = auVar58;
                  auVar68._14_2_ = sVar81 * auVar92._14_2_ + sVar111 * auVar95._14_2_;
                  auVar94._0_4_ = CONCAT22((short)uVar51,(short)(0x100 - uVar51));
                  auVar94._4_4_ = auVar94._0_4_;
                  auVar94._8_4_ = auVar94._0_4_;
                  auVar94._12_4_ = auVar94._0_4_;
                  auVar69._12_4_ = auVar68._12_4_;
                  auVar69._4_4_ = auVar58._8_4_;
                  auVar69._8_4_ = (int)((ulong)auVar58._0_8_ >> 0x20);
                  auVar110 = pshuflw(auVar69,auVar69,0xd8);
                  auVar110 = pshufhw(auVar110,auVar110,0xd8);
                  auVar70._0_2_ = auVar110._0_2_ >> 8;
                  auVar70._2_2_ = auVar110._2_2_ >> 8;
                  auVar70._4_2_ = auVar110._4_2_ >> 8;
                  auVar70._6_2_ = auVar110._6_2_ >> 8;
                  auVar70._8_2_ = auVar110._8_2_ >> 8;
                  auVar70._10_2_ = auVar110._10_2_ >> 8;
                  auVar70._12_2_ = auVar110._12_2_ >> 8;
                  auVar70._14_2_ = auVar110._14_2_ >> 8;
                  auVar110 = pmaddwd(auVar70,auVar94);
                  auVar71._0_4_ = auVar110._0_4_ >> 8;
                  auVar71._4_4_ = auVar110._4_4_ >> 8;
                  auVar71._8_4_ = auVar110._8_4_ >> 8;
                  auVar71._12_4_ = auVar110._12_4_ >> 8;
                  auVar110 = packssdw(auVar71,auVar71);
                  sVar54 = auVar110._0_2_;
                  sVar81 = auVar110._2_2_;
                  sVar108 = auVar110._4_2_;
                  sVar111 = auVar110._6_2_;
                  puVar52[uVar48] =
                       CONCAT13((0 < sVar111) * (sVar111 < 0x100) * auVar110[6] - (0xff < sVar111),
                                CONCAT12((0 < sVar108) * (sVar108 < 0x100) * auVar110[4] -
                                         (0xff < sVar108),
                                         CONCAT11((0 < sVar81) * (sVar81 < 0x100) * auVar110[2] -
                                                  (0xff < sVar81),
                                                  (0 < sVar54) * (sVar54 < 0x100) * auVar110[0] -
                                                  (0xff < sVar54))));
                  uVar42 = uVar42 + uVar117;
                  uVar115 = uVar115 + iVar120;
                  uVar48 = uVar48 + 1;
                } while (uVar45 != uVar48);
              }
              uVar53 = (ulong)(uint)(iVar41 - iVar49);
              puVar52 = puVar52 + iVar49;
            } while (iVar41 - iVar49 != 0);
          }
          goto LAB_0065d97e;
        }
        uVar42 = -uVar117;
        if (0 < (int)uVar117) {
          uVar42 = uVar117;
        }
        puVar52 = buffer;
        if (0x10000 < uVar42) {
          if (0x20000 < uVar42) {
            if (length != 0) {
              auVar72._4_4_ = uVar115;
              auVar72._0_4_ = uVar115;
              auVar72._8_4_ = uVar115;
              auVar72._12_4_ = uVar115;
              auVar110 = ZEXT416(0x100 - (uVar115 >> 8 & 0xff));
              auVar95 = pshuflw(auVar110,auVar110,0);
              auVar110 = pshuflw(auVar72,auVar72,0);
              uVar116 = auVar110._0_2_;
              uVar119 = auVar110._2_2_;
              do {
                iVar120 = (int)uVar53;
                uVar45 = 0x400;
                if (iVar120 < 0x400) {
                  uVar45 = uVar53;
                }
                iVar41 = (int)uVar45;
                fetchTransformedBilinear_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)4,unsigned_int>
                          (buf1,buf2,iVar41,&image->texture,distxs._0_4_,uVar115,uVar117,0);
                (*qPixelLayouts[FVar2].convertToARGB32PM)(buf1,iVar41 * 2,pQVar4);
                (*qPixelLayouts[FVar2].convertToARGB32PM)(buf2,iVar41 * 2,pQVar4);
                if (0 < iVar120) {
                  uVar48 = 0;
                  local_5108 = auVar95._0_2_;
                  sStack_5106 = auVar95._2_2_;
                  uVar53 = CONCAT17(uVar128,CONCAT16(uVar127,CONCAT15(uVar126,CONCAT14(uVar125,
                                                  CONCAT13(uVar124,CONCAT12(uVar123,CONCAT11(uVar122
                                                  ,uVar121))))))) ^
                           CONCAT17(uVar128,CONCAT16(uVar127,CONCAT15(uVar126,CONCAT14(uVar125,
                                                  CONCAT13(uVar124,CONCAT12(uVar123,CONCAT11(uVar122
                                                  ,uVar121)))))));
                  uVar121 = (undefined1)uVar53;
                  uVar122 = (undefined1)(uVar53 >> 8);
                  uVar123 = (undefined1)(uVar53 >> 0x10);
                  uVar124 = (undefined1)(uVar53 >> 0x18);
                  uVar125 = (undefined1)(uVar53 >> 0x20);
                  uVar126 = (undefined1)(uVar53 >> 0x28);
                  uVar127 = (undefined1)(uVar53 >> 0x30);
                  uVar128 = (undefined1)(uVar53 >> 0x38);
                  do {
                    uVar42 = (uint)distxs._0_4_ >> 8 & 0xff;
                    uVar53 = *(ulong *)(buf1 + uVar48 * 2);
                    uVar1 = *(ulong *)(buf2 + uVar48 * 2);
                    auVar79._8_6_ = 0;
                    auVar79._0_8_ = uVar53;
                    auVar79[0xe] = (char)(uVar53 >> 0x38);
                    auVar79[0xf] = uVar128;
                    auVar78._14_2_ = auVar79._14_2_;
                    auVar78._8_5_ = 0;
                    auVar78._0_8_ = uVar53;
                    auVar78[0xd] = uVar127;
                    auVar77._13_3_ = auVar78._13_3_;
                    auVar77._8_4_ = 0;
                    auVar77._0_8_ = uVar53;
                    auVar77[0xc] = (char)(uVar53 >> 0x30);
                    auVar76._12_4_ = auVar77._12_4_;
                    auVar76._8_3_ = 0;
                    auVar76._0_8_ = uVar53;
                    auVar76[0xb] = uVar126;
                    auVar75._11_5_ = auVar76._11_5_;
                    auVar75._8_2_ = 0;
                    auVar75._0_8_ = uVar53;
                    auVar75[10] = (char)(uVar53 >> 0x28);
                    auVar74._10_6_ = auVar75._10_6_;
                    auVar74[8] = 0;
                    auVar74._0_8_ = uVar53;
                    auVar74[9] = uVar125;
                    auVar73._9_7_ = auVar74._9_7_;
                    auVar73[8] = (char)(uVar53 >> 0x20);
                    auVar73._0_8_ = uVar53;
                    Var29 = CONCAT91(CONCAT81(auVar73._8_8_,uVar124),(char)(uVar53 >> 0x18));
                    auVar34._2_10_ = Var29;
                    auVar34[1] = uVar123;
                    auVar34[0] = (char)(uVar53 >> 0x10);
                    auVar33._2_12_ = auVar34;
                    auVar33[1] = uVar122;
                    auVar33[0] = (char)(uVar53 >> 8);
                    auVar102._8_6_ = 0;
                    auVar102._0_8_ = uVar1;
                    auVar102[0xe] = (char)(uVar1 >> 0x38);
                    auVar102[0xf] = uVar128;
                    auVar101._14_2_ = auVar102._14_2_;
                    auVar101._8_5_ = 0;
                    auVar101._0_8_ = uVar1;
                    auVar101[0xd] = uVar127;
                    auVar100._13_3_ = auVar101._13_3_;
                    auVar100._8_4_ = 0;
                    auVar100._0_8_ = uVar1;
                    auVar100[0xc] = (char)(uVar1 >> 0x30);
                    auVar99._12_4_ = auVar100._12_4_;
                    auVar99._8_3_ = 0;
                    auVar99._0_8_ = uVar1;
                    auVar99[0xb] = uVar126;
                    auVar98._11_5_ = auVar99._11_5_;
                    auVar98._8_2_ = 0;
                    auVar98._0_8_ = uVar1;
                    auVar98[10] = (char)(uVar1 >> 0x28);
                    auVar97._10_6_ = auVar98._10_6_;
                    auVar97[8] = 0;
                    auVar97._0_8_ = uVar1;
                    auVar97[9] = uVar125;
                    auVar96._9_7_ = auVar97._9_7_;
                    auVar96[8] = (char)(uVar1 >> 0x20);
                    auVar96._0_8_ = uVar1;
                    Var32 = CONCAT91(CONCAT81(auVar96._8_8_,uVar124),(char)(uVar1 >> 0x18));
                    auVar36._2_10_ = Var32;
                    auVar36[1] = uVar123;
                    auVar36[0] = (char)(uVar1 >> 0x10);
                    auVar35._2_12_ = auVar36;
                    auVar35[1] = uVar122;
                    auVar35[0] = (char)(uVar1 >> 8);
                    auVar104._0_4_ =
                         CONCAT22(auVar35._0_2_ * (uVar119 >> 8) + auVar33._0_2_ * sStack_5106,
                                  CONCAT11(uVar121,(char)uVar1) * (uVar116 >> 8) +
                                  CONCAT11(uVar121,(char)uVar53) * local_5108);
                    auVar85._0_8_ =
                         CONCAT26((short)Var32 * (uVar119 >> 8) + (short)Var29 * sStack_5106,
                                  CONCAT24(auVar36._0_2_ * (uVar116 >> 8) +
                                           auVar34._0_2_ * local_5108,auVar104._0_4_));
                    auVar85._8_2_ = auVar96._8_2_ * (uVar116 >> 8) + auVar73._8_2_ * local_5108;
                    auVar85._10_2_ = auVar98._10_2_ * (uVar119 >> 8) + auVar75._10_2_ * sStack_5106;
                    auVar103._12_2_ = auVar100._12_2_ * (uVar116 >> 8) + auVar77._12_2_ * local_5108
                    ;
                    auVar103._0_12_ = auVar85;
                    auVar103._14_2_ =
                         auVar101._14_2_ * (uVar119 >> 8) + auVar78._14_2_ * sStack_5106;
                    auVar80._0_4_ = CONCAT22((short)uVar42,(short)(0x100 - uVar42));
                    auVar80._4_4_ = auVar80._0_4_;
                    auVar80._8_4_ = auVar80._0_4_;
                    auVar80._12_4_ = auVar80._0_4_;
                    auVar104._12_4_ = auVar103._12_4_;
                    auVar104._4_4_ = auVar85._8_4_;
                    auVar104._8_4_ = (int)((ulong)auVar85._0_8_ >> 0x20);
                    auVar110 = pshuflw(auVar104,auVar104,0xd8);
                    auVar110 = pshufhw(auVar110,auVar110,0xd8);
                    auVar105._0_2_ = auVar110._0_2_ >> 8;
                    auVar105._2_2_ = auVar110._2_2_ >> 8;
                    auVar105._4_2_ = auVar110._4_2_ >> 8;
                    auVar105._6_2_ = auVar110._6_2_ >> 8;
                    auVar105._8_2_ = auVar110._8_2_ >> 8;
                    auVar105._10_2_ = auVar110._10_2_ >> 8;
                    auVar105._12_2_ = auVar110._12_2_ >> 8;
                    auVar105._14_2_ = auVar110._14_2_ >> 8;
                    auVar110 = pmaddwd(auVar105,auVar80);
                    auVar106._0_4_ = auVar110._0_4_ >> 8;
                    auVar106._4_4_ = auVar110._4_4_ >> 8;
                    auVar106._8_4_ = auVar110._8_4_ >> 8;
                    auVar106._12_4_ = auVar110._12_4_ >> 8;
                    auVar110 = packssdw(auVar106,auVar106);
                    sVar54 = auVar110._0_2_;
                    sVar81 = auVar110._2_2_;
                    sVar108 = auVar110._4_2_;
                    sVar111 = auVar110._6_2_;
                    puVar52[uVar48] =
                         CONCAT13((0 < sVar111) * (sVar111 < 0x100) * auVar110[6] - (0xff < sVar111)
                                  ,CONCAT12((0 < sVar108) * (sVar108 < 0x100) * auVar110[4] -
                                            (0xff < sVar108),
                                            CONCAT11((0 < sVar81) * (sVar81 < 0x100) * auVar110[2] -
                                                     (0xff < sVar81),
                                                     (0 < sVar54) * (sVar54 < 0x100) * auVar110[0] -
                                                     (0xff < sVar54))));
                    distxs._0_4_ = distxs._0_4_ + uVar117;
                    uVar48 = uVar48 + 1;
                  } while (uVar45 != uVar48);
                }
                puVar52 = puVar52 + iVar41;
                uVar53 = (ulong)(uint)(iVar120 - iVar41);
              } while (iVar120 - iVar41 != 0);
            }
            goto LAB_0065d97e;
          }
          uVar42 = length + 1U >> 1;
          if (length < 0x400) {
            uVar42 = length;
          }
          fetchTransformedBilinear_simple_scale_helper<(TextureBlendType)5>
                    (buffer,buffer + (int)uVar42,&image->texture,(int *)distxs,(int *)(ulong)uVar115
                     ,uVar117,in_stack_ffffffffffffaed8);
          puVar52 = buffer + (int)uVar42;
          if (uVar42 == length) goto LAB_0065d97e;
        }
        fetchTransformedBilinear_simple_scale_helper<(TextureBlendType)5>
                  (puVar52,buffer + length,&image->texture,(int *)distxs,(int *)(ulong)uVar115,
                   uVar117,in_stack_ffffffffffffaed8);
        goto LAB_0065d97e;
      }
    }
  }
  if (length != 0) {
    dVar84 = data->m13;
    dVar109 = data->m23 * dVar118 + dVar83 * dVar84 + data->m33;
    dVar114 = dVar114 + (double)local_50a8._0_8_ * dVar118 + dVar83 * local_5098;
    local_50d8 = local_50d8 + (double)local_50a8._8_8_ * dVar118 + dVar83 * dStack_5090;
    puVar52 = buffer;
    do {
      iVar120 = (int)uVar53;
      uVar45 = 0x400;
      if (iVar120 < 0x400) {
        uVar45 = uVar53;
      }
      if (0 < iVar120) {
        puVar5 = (data->field_23).texture.imageData;
        lVar6 = (data->field_23).texture.bytesPerLine;
        uVar115 = (data->field_23).texture.width;
        uVar117 = (data->field_23).texture.height;
        uVar53 = 0;
        do {
          dVar83 = (double)(-(ulong)(dVar109 == 0.0) & 0x40d0000000000000 |
                           ~-(ulong)(dVar109 == 0.0) & (ulong)(1.0 / dVar109));
          dVar112 = dVar114 * dVar83 + -0.5;
          dVar55 = local_50d8 * dVar83 + -0.5;
          dVar83 = floor(dVar112);
          dVar118 = floor(dVar55);
          distxs[uVar53] = (ushort)(int)((dVar112 - (double)(int)dVar83) * 65536.0);
          distys[uVar53] = (ushort)(int)((dVar55 - (double)(int)dVar118) * 65536.0);
          iVar41 = (int)dVar83 % (int)uVar115;
          uVar42 = iVar41 >> 0x1f & uVar115;
          uVar51 = uVar42 + iVar41 + 1;
          if (uVar51 == uVar115) {
            uVar51 = 0;
          }
          iVar49 = (int)dVar118 % (int)uVar117;
          uVar43 = iVar49 >> 0x1f & uVar117;
          uVar44 = uVar43 + iVar49 + 1;
          if (uVar44 == uVar117) {
            uVar44 = 0;
          }
          lVar47 = (int)(uVar43 + iVar49) * lVar6;
          lVar46 = (int)uVar44 * lVar6;
          lVar50 = (long)(int)(uVar42 + iVar41);
          buf1[uVar53 * 2] = (uint)*(ushort *)(puVar5 + lVar50 * 2 + lVar47);
          buf1[uVar53 * 2 + 1] = (uint)*(ushort *)(puVar5 + (long)(int)uVar51 * 2 + lVar47);
          buf2[uVar53 * 2] = (uint)*(ushort *)(puVar5 + lVar50 * 2 + lVar46);
          buf2[uVar53 * 2 + 1] = (uint)*(ushort *)(puVar5 + (long)(int)uVar51 * 2 + lVar46);
          dVar114 = dVar114 + local_5098;
          local_50d8 = local_50d8 + dStack_5090;
          dVar109 = dVar109 + dVar84;
          uVar53 = uVar53 + 1;
        } while (uVar45 != uVar53);
      }
      iVar41 = (int)uVar45;
      (*qPixelLayouts[FVar2].convertToARGB32PM)(buf1,iVar41 * 2,pQVar4);
      (*qPixelLayouts[FVar2].convertToARGB32PM)(buf2,iVar41 * 2,pQVar4);
      if (0 < iVar120) {
        uVar53 = 0;
        do {
          uVar48 = *(ulong *)(buf1 + uVar53 * 2);
          uVar1 = *(ulong *)(buf2 + uVar53 * 2);
          bVar82 = (byte)(uVar48 >> 0x38);
          auVar8._8_6_ = 0;
          auVar8._0_8_ = uVar48;
          auVar8[0xe] = bVar82;
          auVar10._8_4_ = 0;
          auVar10._0_8_ = uVar48;
          auVar10[0xc] = (char)(uVar48 >> 0x30);
          auVar10._13_2_ = auVar8._13_2_;
          auVar12._8_4_ = 0;
          auVar12._0_8_ = uVar48;
          auVar12._12_3_ = auVar10._12_3_;
          auVar14._8_2_ = 0;
          auVar14._0_8_ = uVar48;
          auVar14[10] = (char)(uVar48 >> 0x28);
          auVar14._11_4_ = auVar12._11_4_;
          auVar16._8_2_ = 0;
          auVar16._0_8_ = uVar48;
          auVar16._10_5_ = auVar14._10_5_;
          auVar18[8] = (char)(uVar48 >> 0x20);
          auVar18._0_8_ = uVar48;
          auVar18._9_6_ = auVar16._9_6_;
          auVar19._7_8_ = 0;
          auVar19._0_7_ = auVar18._8_7_;
          Var20 = CONCAT81(SUB158(auVar19 << 0x40,7),(char)(uVar48 >> 0x18));
          auVar37._9_6_ = 0;
          auVar37._0_9_ = Var20;
          auVar21._1_10_ = SUB1510(auVar37 << 0x30,5);
          auVar21[0] = (char)(uVar48 >> 0x10);
          auVar38._11_4_ = 0;
          auVar38._0_11_ = auVar21;
          auVar22._1_12_ = SUB1512(auVar38 << 0x20,3);
          auVar22[0] = (char)(uVar48 >> 8);
          bVar107 = (byte)(uVar1 >> 0x38);
          auVar7._8_6_ = 0;
          auVar7._0_8_ = uVar1;
          auVar7[0xe] = bVar107;
          auVar9._8_4_ = 0;
          auVar9._0_8_ = uVar1;
          auVar9[0xc] = (char)(uVar1 >> 0x30);
          auVar9._13_2_ = auVar7._13_2_;
          auVar11._8_4_ = 0;
          auVar11._0_8_ = uVar1;
          auVar11._12_3_ = auVar9._12_3_;
          auVar13._8_2_ = 0;
          auVar13._0_8_ = uVar1;
          auVar13[10] = (char)(uVar1 >> 0x28);
          auVar13._11_4_ = auVar11._11_4_;
          auVar15._8_2_ = 0;
          auVar15._0_8_ = uVar1;
          auVar15._10_5_ = auVar13._10_5_;
          auVar17[8] = (char)(uVar1 >> 0x20);
          auVar17._0_8_ = uVar1;
          auVar17._9_6_ = auVar15._9_6_;
          auVar23._7_8_ = 0;
          auVar23._0_7_ = auVar17._8_7_;
          Var24 = CONCAT81(SUB158(auVar23 << 0x40,7),(char)(uVar1 >> 0x18));
          auVar39._9_6_ = 0;
          auVar39._0_9_ = Var24;
          auVar25._1_10_ = SUB1510(auVar39 << 0x30,5);
          auVar25[0] = (char)(uVar1 >> 0x10);
          auVar40._11_4_ = 0;
          auVar40._0_11_ = auVar25;
          auVar26._1_12_ = SUB1512(auVar40 << 0x20,3);
          auVar26[0] = (char)(uVar1 >> 8);
          uVar115 = (uint)*(byte *)((long)distys + uVar53 * 2 + 1);
          auVar110 = pshuflw(ZEXT416(0x100 - uVar115),ZEXT416(0x100 - uVar115),0);
          sVar108 = auVar110._0_2_;
          sVar111 = auVar110._2_2_;
          auVar110 = pshuflw(ZEXT416(uVar115),ZEXT416(uVar115),0);
          sVar54 = auVar110._0_2_;
          sVar81 = auVar110._2_2_;
          auVar60._0_4_ =
               CONCAT22(sVar81 * auVar26._0_2_ + sVar111 * auVar22._0_2_,
                        sVar54 * (ushort)(byte)uVar1 + sVar108 * (ushort)(byte)uVar48);
          auVar57._0_8_ =
               CONCAT26(sVar81 * (short)Var24 + sVar111 * (short)Var20,
                        CONCAT24(sVar54 * auVar25._0_2_ + sVar108 * auVar21._0_2_,auVar60._0_4_));
          auVar57._8_2_ = sVar54 * auVar17._8_2_ + sVar108 * auVar18._8_2_;
          auVar57._10_2_ = sVar81 * auVar13._10_2_ + sVar111 * auVar14._10_2_;
          auVar59._12_2_ = sVar54 * auVar9._12_2_ + sVar108 * auVar10._12_2_;
          auVar59._0_12_ = auVar57;
          auVar59._14_2_ = sVar81 * (ushort)bVar107 + sVar111 * (ushort)bVar82;
          auVar86._0_4_ = CONCAT22(distxs[uVar53] >> 8,0x100 - (distxs[uVar53] >> 8));
          auVar86._4_4_ = auVar86._0_4_;
          auVar86._8_4_ = auVar86._0_4_;
          auVar86._12_4_ = auVar86._0_4_;
          auVar60._12_4_ = auVar59._12_4_;
          auVar60._4_4_ = auVar57._8_4_;
          auVar60._8_4_ = (int)((ulong)auVar57._0_8_ >> 0x20);
          auVar110 = pshuflw(auVar60,auVar60,0xd8);
          auVar110 = pshufhw(auVar110,auVar110,0xd8);
          auVar61._0_2_ = auVar110._0_2_ >> 8;
          auVar61._2_2_ = auVar110._2_2_ >> 8;
          auVar61._4_2_ = auVar110._4_2_ >> 8;
          auVar61._6_2_ = auVar110._6_2_ >> 8;
          auVar61._8_2_ = auVar110._8_2_ >> 8;
          auVar61._10_2_ = auVar110._10_2_ >> 8;
          auVar61._12_2_ = auVar110._12_2_ >> 8;
          auVar61._14_2_ = auVar110._14_2_ >> 8;
          auVar110 = pmaddwd(auVar61,auVar86);
          auVar62._0_4_ = auVar110._0_4_ >> 8;
          auVar62._4_4_ = auVar110._4_4_ >> 8;
          auVar62._8_4_ = auVar110._8_4_ >> 8;
          auVar62._12_4_ = auVar110._12_4_ >> 8;
          auVar110 = packssdw(auVar62,auVar62);
          sVar54 = auVar110._0_2_;
          sVar81 = auVar110._2_2_;
          sVar108 = auVar110._4_2_;
          sVar111 = auVar110._6_2_;
          puVar52[uVar53] =
               CONCAT13((0 < sVar111) * (sVar111 < 0x100) * auVar110[6] - (0xff < sVar111),
                        CONCAT12((0 < sVar108) * (sVar108 < 0x100) * auVar110[4] - (0xff < sVar108),
                                 CONCAT11((0 < sVar81) * (sVar81 < 0x100) * auVar110[2] -
                                          (0xff < sVar81),
                                          (0 < sVar54) * (sVar54 < 0x100) * auVar110[0] -
                                          (0xff < sVar54))));
          uVar53 = uVar53 + 1;
        } while (uVar45 != uVar53);
      }
      puVar52 = puVar52 + iVar41;
      uVar53 = (ulong)(uint)(iVar120 - iVar41);
    } while (iVar120 - iVar41 != 0);
  }
LAB_0065d97e:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return buffer;
  }
  __stack_chk_fail();
}

Assistant:

static const uint *QT_FASTCALL fetchTransformedBilinear(uint *buffer, const Operator *,
                                                        const QSpanData *data, int y, int x, int length)
{
    const QPixelLayout *layout = &qPixelLayouts[data->texture.format];
    const QList<QRgb> *clut = data->texture.colorTable;
    Q_ASSERT(bpp == QPixelLayout::BPPNone || layout->bpp == bpp);

    const qreal cx = x + qreal(0.5);
    const qreal cy = y + qreal(0.5);

    if (canUseFastMatrixPath(cx, cy, length, data)) {
        // The increment pr x in the scanline
        int fdx = (int)(data->m11 * fixed_scale);
        int fdy = (int)(data->m12 * fixed_scale);

        int fx = int((data->m21 * cy + data->m11 * cx + data->dx) * fixed_scale);
        int fy = int((data->m22 * cy + data->m12 * cx + data->dy) * fixed_scale);

        fx -= half_point;
        fy -= half_point;

        if (fdy == 0) { // simple scale, no rotation or shear
            if (qAbs(fdx) <= fixed_scale) { // scale up on X
                fetchTransformedBilinear_simple_scale_helper<blendType>(buffer, buffer + length, data->texture, fx, fy, fdx, fdy);
            } else if (qAbs(fdx) <= 2 * fixed_scale) { // scale down on X less than 2x
                const int mid = (length * 2 < BufferSize) ? length : ((length + 1) / 2);
                fetchTransformedBilinear_simple_scale_helper<blendType>(buffer, buffer + mid, data->texture, fx, fy, fdx, fdy);
                if (mid != length)
                    fetchTransformedBilinear_simple_scale_helper<blendType>(buffer + mid, buffer + length, data->texture, fx, fy, fdx, fdy);
            } else {
                const auto fetcher = fetchTransformedBilinear_fetcher<blendType,bpp,uint>;

                Q_DECL_UNINITIALIZED uint buf1[BufferSize];
                Q_DECL_UNINITIALIZED uint buf2[BufferSize];
                uint *b = buffer;
                while (length) {
                    int len = qMin(length, BufferSize / 2);
                    fetcher(buf1, buf2, len, data->texture, fx, fy, fdx, 0);
                    layout->convertToARGB32PM(buf1, len * 2, clut);
                    layout->convertToARGB32PM(buf2, len * 2, clut);

                    if (hasFastInterpolate4() || qAbs(data->m22) < qreal(1./8.)) { // scale up more than 8x (on Y)
                        int disty = (fy & 0x0000ffff) >> 8;
                        for (int i = 0; i < len; ++i) {
                            int distx = (fx & 0x0000ffff) >> 8;
                            b[i] = interpolate_4_pixels(buf1 + i * 2, buf2 + i * 2, distx, disty);
                            fx += fdx;
                        }
                    } else {
                        int disty = ((fy & 0x0000ffff) + 0x0800) >> 12;
                        for (int i = 0; i < len; ++i) {
                            uint tl = buf1[i * 2 + 0];
                            uint tr = buf1[i * 2 + 1];
                            uint bl = buf2[i * 2 + 0];
                            uint br = buf2[i * 2 + 1];
                            int distx = ((fx & 0x0000ffff) + 0x0800) >> 12;
                            b[i] = interpolate_4_pixels_16(tl, tr, bl, br, distx, disty);
                            fx += fdx;
                        }
                    }
                    length -= len;
                    b += len;
                }
            }
        } else { // rotation or shear
            const auto fetcher = fetchTransformedBilinear_fetcher<blendType,bpp,uint>;

            Q_DECL_UNINITIALIZED uint buf1[BufferSize];
            Q_DECL_UNINITIALIZED uint buf2[BufferSize];
            uint *b = buffer;
            while (length) {
                int len = qMin(length, BufferSize / 2);
                fetcher(buf1, buf2, len, data->texture, fx, fy, fdx, fdy);
                layout->convertToARGB32PM(buf1, len * 2, clut);
                layout->convertToARGB32PM(buf2, len * 2, clut);

                if (hasFastInterpolate4() || qAbs(data->m11) < qreal(1./8.) || qAbs(data->m22) < qreal(1./8.)) {
                    // If we are zooming more than 8 times, we use 8bit precision for the position.
                    for (int i = 0; i < len; ++i) {
                        int distx = (fx & 0x0000ffff) >> 8;
                        int disty = (fy & 0x0000ffff) >> 8;

                        b[i] = interpolate_4_pixels(buf1 + i * 2, buf2 + i * 2, distx, disty);
                        fx += fdx;
                        fy += fdy;
                    }
                } else {
                    // We are zooming less than 8x, use 4bit precision
                    for (int i = 0; i < len; ++i) {
                        uint tl = buf1[i * 2 + 0];
                        uint tr = buf1[i * 2 + 1];
                        uint bl = buf2[i * 2 + 0];
                        uint br = buf2[i * 2 + 1];

                        int distx = ((fx & 0x0000ffff) + 0x0800) >> 12;
                        int disty = ((fy & 0x0000ffff) + 0x0800) >> 12;

                        b[i] = interpolate_4_pixels_16(tl, tr, bl, br, distx, disty);
                        fx += fdx;
                        fy += fdy;
                    }
                }

                length -= len;
                b += len;
            }
        }
    } else {
        const auto fetcher = fetchTransformedBilinear_slow_fetcher<blendType,bpp,uint>;

        const qreal fdx = data->m11;
        const qreal fdy = data->m12;
        const qreal fdw = data->m13;

        qreal fx = data->m21 * cy + data->m11 * cx + data->dx;
        qreal fy = data->m22 * cy + data->m12 * cx + data->dy;
        qreal fw = data->m23 * cy + data->m13 * cx + data->m33;

        Q_DECL_UNINITIALIZED uint buf1[BufferSize];
        Q_DECL_UNINITIALIZED uint buf2[BufferSize];
        uint *b = buffer;

        Q_DECL_UNINITIALIZED ushort distxs[BufferSize / 2];
        Q_DECL_UNINITIALIZED ushort distys[BufferSize / 2];

        while (length) {
            const int len = qMin(length, BufferSize / 2);
            fetcher(buf1, buf2, distxs, distys, len, data->texture, fx, fy, fw, fdx, fdy, fdw);

            layout->convertToARGB32PM(buf1, len * 2, clut);
            layout->convertToARGB32PM(buf2, len * 2, clut);

            for (int i = 0; i < len; ++i) {
                const int distx = distxs[i] >> 8;
                const int disty = distys[i] >> 8;

                b[i] = interpolate_4_pixels(buf1 + i * 2, buf2 + i * 2, distx, disty);
            }
            length -= len;
            b += len;
        }
    }

    return buffer;
}